

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfirstdiff_s.c
# Opt level: O1

errno_t strfirstdiff_s(char *dest,rsize_t dmax,char *src,rsize_t *index)

{
  long lVar1;
  rsize_t rVar2;
  errno_t error;
  errno_t eVar3;
  char *msg;
  char cVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (index == (rsize_t *)0x0) {
    msg = "strfirstdiff_s: index is null";
LAB_00105425:
    eVar3 = 400;
    error = 400;
  }
  else {
    *index = 0;
    if (dest == (char *)0x0) {
      msg = "strfirstdiff_s: dest is null";
      goto LAB_00105425;
    }
    if (src == (char *)0x0) {
      msg = "strfirstdiff_s: src is null";
      goto LAB_00105425;
    }
    if (dmax == 0) {
      msg = "strfirstdiff_s: dmax is 0";
      eVar3 = 0x191;
      error = 0x191;
    }
    else {
      if (dmax < 0x10000001) {
        cVar4 = *dest;
        eVar3 = 0x198;
        if (cVar4 != '\0') {
          rVar2 = 0;
          do {
            if ((src[rVar2] == '\0') || (dmax == rVar2)) break;
            if (cVar4 != src[rVar2]) {
              *index = rVar2;
              eVar3 = 0;
              break;
            }
            cVar4 = dest[rVar2 + 1];
            rVar2 = rVar2 + 1;
          } while (cVar4 != '\0');
        }
        goto LAB_00105436;
      }
      msg = "strfirstdiff_s: dmax exceeds max";
      eVar3 = 0x193;
      error = 0x193;
    }
  }
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_00105436:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return eVar3;
}

Assistant:

errno_t
 strfirstdiff_s (const char *dest, rsize_t dmax,
                 const char *src, rsize_t *index)
{
    const char *rp;

    if (index == NULL) {
        invoke_safe_str_constraint_handler("strfirstdiff_s: index is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }
    *index = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strfirstdiff_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strfirstdiff_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0 ) {
        invoke_safe_str_constraint_handler("strfirstdiff_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strfirstdiff_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /* hold reference point */
    rp = dest;

    while (*dest && *src && dmax) {

        if (*dest != *src) {
            *index = dest - rp;
            return (EOK);
        }
        dmax--;
        dest++;
        src++;
    }

    return (ESNODIFF);
}